

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  char *pcVar6;
  uchar *puVar7;
  Mem *pMVar8;
  uint uVar10;
  ulong uVar9;
  ulong uVar11;
  char **ppcVar12;
  Vdbe *pVm;
  Vdbe *p;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_70;
  int local_64;
  sqlite3 *local_60;
  char *local_58;
  uint local_4c;
  sqlite3_callback local_48;
  char **local_40;
  void *local_38;
  
  local_70 = (Vdbe *)0x0;
  local_48 = xCallback;
  local_40 = pzErrMsg;
  local_38 = pArg;
  iVar3 = sqlite3SafetyCheckOk(db);
  if (iVar3 == 0) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1ffa2,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    return 0x15;
  }
  pcVar6 = "";
  if (zSql != (char *)0x0) {
    pcVar6 = zSql;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  db->errCode = 0;
  local_60 = db;
  if (db->pErr == (sqlite3_value *)0x0) {
    db->errByteOffset = -1;
  }
  else {
    sqlite3ErrorFinish(db,0);
  }
  while( true ) {
    if (*pcVar6 == '\0') break;
    local_70 = (Vdbe *)0x0;
    iVar3 = sqlite3LockAndPrepare
                      (db,pcVar6,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_70,&local_58);
    if (iVar3 != 0) goto LAB_0013d613;
    if (local_70 == (Vdbe *)0x0) {
      iVar3 = 0;
      pcVar6 = local_58;
    }
    else {
      ppcVar5 = (char **)0x0;
      bVar2 = false;
      uVar10 = 0;
      ppcVar12 = (char **)0x0;
      p = local_70;
      do {
        iVar3 = sqlite3_step((sqlite3_stmt *)p);
        if (local_48 != (sqlite3_callback)0x0) {
          local_64 = iVar3;
          if (iVar3 == 100) {
            uVar9 = (ulong)uVar10;
            if (!bVar2) goto LAB_0013d455;
LAB_0013d4b6:
            ppcVar12 = ppcVar5 + uVar9;
            if ((int)(uint)uVar9 < 1) {
              uVar11 = 0;
            }
            else {
              uVar11 = 0;
              local_4c = (uint)uVar9;
              do {
                puVar7 = sqlite3_column_text((sqlite3_stmt *)local_70,(int)uVar11);
                p = local_70;
                ppcVar12[uVar11] = (char *)puVar7;
                if (puVar7 == (uchar *)0x0) {
                  pMVar8 = columnMem((sqlite3_stmt *)local_70,(int)uVar11);
                  uVar10._0_2_ = pMVar8->flags;
                  uVar10._2_1_ = pMVar8->enc;
                  uVar10._3_1_ = pMVar8->eSubtype;
                  columnMallocFailure((sqlite3_stmt *)p);
                  db = local_60;
                  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
                    sqlite3OomFault(local_60);
                    iVar3 = 100;
                    goto LAB_0013d61b;
                  }
                }
                uVar11 = uVar11 + 1;
              } while (uVar9 != uVar11);
              uVar11 = uVar9;
              uVar9 = (ulong)local_4c;
            }
            ppcVar12[uVar11] = (char *)0x0;
          }
          else {
            if (((iVar3 != 0x65) || (bVar2)) || ((local_60->flags & 0x100) == 0)) break;
LAB_0013d455:
            if (p == (Vdbe *)0x0) {
              uVar9 = 0;
            }
            else {
              uVar9 = (ulong)p->nResColumn;
            }
            ppcVar5 = (char **)sqlite3DbMallocRawNN(local_60,(ulong)((int)uVar9 << 4 | 8));
            if (ppcVar5 == (char **)0x0) {
              ppcVar5 = (char **)0x0;
              db = local_60;
              iVar3 = local_64;
              goto LAB_0013d61b;
            }
            if ((int)uVar9 != 0) {
              uVar11 = 0;
              do {
                pcVar6 = (char *)columnName((sqlite3_stmt *)p,(int)uVar11,0,0);
                ppcVar5[uVar11] = pcVar6;
                uVar11 = uVar11 + 1;
              } while (uVar9 != uVar11);
            }
            if (local_64 == 100) goto LAB_0013d4b6;
          }
          iVar3 = local_64;
          uVar10 = (uint)uVar9;
          iVar4 = (*local_48)(local_38,uVar10,ppcVar12,ppcVar5);
          bVar2 = true;
          p = local_70;
          if (iVar4 != 0) {
            sqlite3VdbeFinalize(local_70);
            db = local_60;
            local_70 = (Vdbe *)0x0;
            local_60->errCode = 4;
            iVar3 = 4;
            sqlite3ErrorFinish(local_60,4);
            goto LAB_0013d62d;
          }
        }
      } while (iVar3 == 100);
      iVar3 = sqlite3VdbeFinalize(p);
      db = local_60;
      local_70 = (Vdbe *)0x0;
      pcVar6 = local_58 + -1;
      do {
        pbVar1 = (byte *)(pcVar6 + 1);
        pcVar6 = pcVar6 + 1;
      } while ((""[*pbVar1] & 1) != 0);
      if (ppcVar5 != (char **)0x0) {
        sqlite3DbFreeNN(local_60,ppcVar5);
      }
    }
    if (iVar3 != 0) goto LAB_0013d613;
  }
  iVar3 = 0;
LAB_0013d613:
  ppcVar5 = (char **)0x0;
  p = local_70;
LAB_0013d61b:
  if (p != (Vdbe *)0x0) {
    sqlite3VdbeFinalize(p);
  }
  if (ppcVar5 != (char **)0x0) {
LAB_0013d62d:
    sqlite3DbFreeNN(db,ppcVar5);
  }
  ppcVar5 = local_40;
  if ((iVar3 == 0) && (db->mallocFailed == '\0')) {
    iVar3 = 0;
  }
  else {
    iVar3 = apiHandleError(db,iVar3);
    if ((ppcVar5 != (char **)0x0) && (iVar3 != 0)) {
      pcVar6 = sqlite3_errmsg(db);
      pcVar6 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar6);
      *ppcVar5 = pcVar6;
      if (pcVar6 == (char *)0x0) {
        db->errCode = 7;
        iVar3 = 7;
        sqlite3ErrorFinish(db,7);
      }
      goto LAB_0013d6a1;
    }
  }
  if (ppcVar5 != (char **)0x0) {
    *ppcVar5 = (char *)0x0;
  }
LAB_0013d6a1:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc ||
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}